

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionAnalyzer.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_239::Hasher::Hasher
          (Hasher *this,Expression *curr,bool visitChildren,ExprHasher *custom)

{
  Name curr_00;
  bool bVar1;
  size_t sVar2;
  Expression **ppEVar3;
  TypeID local_68;
  int local_5c;
  size_t local_58;
  char *pcStack_50;
  int local_2c;
  ExprHasher *local_28;
  ExprHasher *custom_local;
  Expression *pEStack_18;
  bool visitChildren_local;
  Expression *curr_local;
  Hasher *this_local;
  
  this->visitChildren = visitChildren;
  local_2c = 0;
  local_28 = custom;
  custom_local._7_1_ = visitChildren;
  pEStack_18 = curr;
  curr_local = (Expression *)this;
  sVar2 = hash<int>(&local_2c);
  this->digest = sVar2;
  this->internalCounter = 0;
  std::
  map<wasm::Name,_unsigned_int,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
  ::map(&this->internalNames);
  SmallVector<wasm::Expression_*,_10UL>::SmallVector(&this->stack);
  SmallVector<wasm::Expression_*,_10UL>::push_back(&this->stack,&stack0xffffffffffffffe8);
  local_58 = DELEGATE_CALLER_TARGET;
  pcStack_50 = DAT_031942b8;
  curr_00.super_IString.str._M_str = DAT_031942b8;
  curr_00.super_IString.str._M_len = DELEGATE_CALLER_TARGET;
  noteScopeName(this,curr_00);
  while (sVar2 = SmallVector<wasm::Expression_*,_10UL>::size(&this->stack), sVar2 != 0) {
    ppEVar3 = SmallVector<wasm::Expression_*,_10UL>::back(&this->stack);
    pEStack_18 = *ppEVar3;
    SmallVector<wasm::Expression_*,_10UL>::pop_back(&this->stack);
    if (pEStack_18 == (Expression *)0x0) {
      local_5c = 0;
      rehash<int>(&this->digest,&local_5c);
    }
    else {
      rehash<wasm::Expression::Id>(&this->digest,&pEStack_18->_id);
      local_68 = wasm::Type::getID(&pEStack_18->type);
      rehash<unsigned_long>(&this->digest,&local_68);
      bVar1 = std::function<bool_(wasm::Expression_*,_unsigned_long_&)>::operator()
                        (custom,pEStack_18,&this->digest);
      if (!bVar1) {
        hashExpression(this,pEStack_18);
      }
    }
  }
  return;
}

Assistant:

Hasher(Expression* curr,
         bool visitChildren,
         ExpressionAnalyzer::ExprHasher custom)
    : visitChildren(visitChildren) {
    stack.push_back(curr);
    // DELEGATE_CALLER_TARGET is a fake target used to denote delegating to
    // the caller. Add it here to prevent the unknown name error.
    noteScopeName(DELEGATE_CALLER_TARGET);

    while (stack.size() > 0) {
      curr = stack.back();
      stack.pop_back();
      if (!curr) {
        // This was an optional child that was not present. Hash a 0 to
        // represent that.
        rehash(digest, 0);
        continue;
      }
      rehash(digest, curr->_id);
      // we often don't need to hash the type, as it is tied to other values
      // we are hashing anyhow, but there are exceptions: for example, a
      // local.get's type is determined by the function, so if we are
      // hashing only expression fragments, then two from different
      // functions may turn out the same even if the type differs. Likewise,
      // if we hash between modules, then we need to take int account
      // call_imports type, etc. The simplest thing is just to hash the
      // type for all of them.
      rehash(digest, curr->type.getID());
      // If the custom hasher handled this expr, then we have nothing to do.
      if (custom(curr, digest)) {
        continue;
      }
      // Hash the contents of the expression normally.
      hashExpression(curr);
    }
  }